

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O2

Cluster * __thiscall
AddressMap<std::pair<int,_unsigned_long>_>::FindCluster
          (AddressMap<std::pair<int,_unsigned_long>_> *this,Number address,bool create)

{
  Cluster **ppCVar1;
  Cluster *pCVar2;
  Object *__s;
  Object *pOVar3;
  uint uVar4;
  
  pOVar3 = (Object *)(address >> 0x14);
  uVar4 = (uint)((int)pOVar3 * -0x61c88647) >> 0x14;
  pCVar2 = (Cluster *)((ulong)(uVar4 << 3) + (long)this->hashtable_);
  do {
    pCVar2 = pCVar2->next;
    if (pCVar2 == (Cluster *)0x0) {
      if (create) {
        __s = (Object *)(*this->alloc_)(0x10018);
        memset(__s,0,0x10018);
        __s->next = this->allocated_;
        this->allocated_ = __s;
        __s[2].next = pOVar3;
        ppCVar1 = this->hashtable_;
        __s[1].next = (Object *)ppCVar1[uVar4];
        ppCVar1[uVar4] = (Cluster *)(__s + 1);
        return (Cluster *)(__s + 1);
      }
      return (Cluster *)0x0;
    }
  } while ((Object *)pCVar2->id != pOVar3);
  return pCVar2;
}

Assistant:

Cluster* FindCluster(Number address, bool create) {
    // Look in hashtable
    const Number cluster_id = address >> (kBlockBits + kClusterBits);
    const int h = HashInt(cluster_id);
    for (Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      if (c->id == cluster_id) {
        return c;
      }
    }

    // Create cluster if necessary
    if (create) {
      Cluster* c = New<Cluster>(1);
      c->id = cluster_id;
      c->next = hashtable_[h];
      hashtable_[h] = c;
      return c;
    }
    return nullptr;
  }